

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void sptk::world::anon_unknown_3::SetParametersForLinearSmoothing
               (int boundary,int fft_size,int fs,double width,double *power_spectrum,
               double *mirroring_spectrum,double *mirroring_segment,double *frequency_axis)

{
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  double *mirroring_segment_local;
  double *mirroring_spectrum_local;
  double *power_spectrum_local;
  double width_local;
  int fs_local;
  int fft_size_local;
  int boundary_local;
  
  for (i = 0; i_1 = boundary, i < boundary; i = i + 1) {
    mirroring_spectrum[i] = power_spectrum[boundary - i];
  }
  for (; i_1 < fft_size / 2 + boundary; i_1 = i_1 + 1) {
    mirroring_spectrum[i_1] = power_spectrum[i_1 - boundary];
  }
  for (i_2 = fft_size / 2 + boundary; i_2 <= fft_size / 2 + boundary * 2; i_2 = i_2 + 1) {
    mirroring_spectrum[i_2] = power_spectrum[fft_size / 2 - (i_2 - (fft_size / 2 + boundary))];
  }
  *mirroring_segment = (*mirroring_spectrum * (double)fs) / (double)fft_size;
  for (i_3 = 1; i_3 < fft_size / 2 + boundary * 2 + 1; i_3 = i_3 + 1) {
    mirroring_segment[i_3] =
         (mirroring_spectrum[i_3] * (double)fs) / (double)fft_size + mirroring_segment[i_3 + -1];
  }
  for (i_4 = 0; i_4 <= fft_size / 2; i_4 = i_4 + 1) {
    frequency_axis[i_4] = ((double)i_4 / (double)fft_size) * (double)fs + -(width / 2.0);
  }
  return;
}

Assistant:

static void SetParametersForLinearSmoothing(int boundary, int fft_size, int fs,
    double width, const double *power_spectrum, double *mirroring_spectrum,
    double *mirroring_segment, double *frequency_axis) {
  for (int i = 0; i < boundary; ++i)
    mirroring_spectrum[i] = power_spectrum[boundary - i];
  for (int i = boundary; i < fft_size / 2 + boundary; ++i)
    mirroring_spectrum[i] = power_spectrum[i - boundary];
  for (int i = fft_size / 2 + boundary; i <= fft_size / 2 + boundary * 2; ++i)
    mirroring_spectrum[i] =
      power_spectrum[fft_size / 2 - (i - (fft_size / 2 + boundary))];

  mirroring_segment[0] = mirroring_spectrum[0] * fs / fft_size;
  for (int i = 1; i < fft_size / 2 + boundary * 2 + 1; ++i)
    mirroring_segment[i] = mirroring_spectrum[i] * fs / fft_size +
    mirroring_segment[i - 1];

  for (int i = 0; i <= fft_size / 2; ++i)
    frequency_axis[i] = static_cast<double>(i) / fft_size *
    fs - width / 2.0;
}